

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  FILE *__stream;
  rnndb *db;
  char *pcVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  char *local_f118;
  rnndeccolors *local_f108;
  code *local_f100;
  obj obj [256];
  state s;
  
  local_f100 = (code *)0x0;
  memset(&s,0,0xd8c8);
  local_f108 = (rnndeccolors *)0x0;
  uVar8 = 0;
  local_f118 = (char *)0x0;
  iVar6 = 1;
  while (iVar6 < argc) {
    pcVar3 = argv[iVar6];
    if (*pcVar3 != '-') goto switchD_00102818_caseD_6e;
    iVar5 = iVar6;
    switch(pcVar3[1]) {
    case 'm':
      if ((pcVar3[2] != '\0') || (iVar5 = iVar6 + 1, argc <= iVar5)) goto switchD_00102818_caseD_6e;
      pcVar3 = argv[iVar5];
      iVar6 = strncasecmp(pcVar3,"NV",2);
      if (iVar6 == 0) {
        pcVar3 = pcVar3 + 2;
      }
      uVar1 = strtoul(pcVar3,(char **)0x0,0x10);
      s.chipset = (uint32_t)uVar1;
      break;
    case 'n':
    case 'p':
    case 'q':
    case 's':
    case 't':
    case 'u':
    case 'w':
      goto switchD_00102818_caseD_6e;
    case 'o':
      if (((pcVar3[2] != '\0') || (iVar5 = iVar6 + 2, argc <= iVar5)) || (uVar8 == 0x100))
      goto switchD_00102818_caseD_6e;
      uVar1 = strtoul(argv[(long)iVar6 + 1],(char **)0x0,0x10);
      obj[(int)uVar8].handle = (uint32_t)uVar1;
      uVar1 = strtoul(argv[iVar5],(char **)0x0,0x10);
      obj[(int)uVar8].class = (uint32_t)uVar1;
      uVar8 = uVar8 + 1;
      break;
    case 'r':
      if ((pcVar3[2] == '\0') && (iVar5 = iVar6 + 1, iVar5 < argc)) {
        s.op.parse = parse_renouveau;
        goto LAB_0010298d;
      }
      goto switchD_00102818_caseD_6e;
    case 'v':
      if ((pcVar3[2] != '\0') || (iVar5 = iVar6 + 2, argc <= iVar5)) goto switchD_00102818_caseD_6e;
      s.op.parse = parse_valgrind;
      lVar2 = strtol(argv[(long)iVar6 + 1],(char **)0x0,10);
      s.filter.map = (int)lVar2;
LAB_0010298d:
      local_f118 = argv[iVar5];
      break;
    case 'x':
      if (pcVar3[2] != '\0') goto switchD_00102818_caseD_6e;
      s.op.flush = flush_raw;
      local_f100 = flush_raw;
      break;
    default:
      if ((pcVar3[1] != 'c') || (pcVar3[2] != '\0')) goto switchD_00102818_caseD_6e;
      s.colors = &rnndec_colorsterm;
      local_f108 = &rnndec_colorsterm;
    }
    iVar6 = iVar5 + 1;
  }
  if (local_f118 == (char *)0x0) {
switchD_00102818_caseD_6e:
    fprintf(_stderr,
            "usage: %s [ -x ] [ -c ] [ -m \'chipset\' ] [ -o \'handle\' \'class\' ] [ -r \'file\' ] [ -v \'map\' \'file\' ]\n\t-x\tHexadecimal output mode.\n\t-c\tClassy output mode.\n\t-m\tForce chipset version.\n\t-o\tForce handle to class mapping (repeat for multiple mappings).\n\t-r\tParse a renouveau trace.\n\t-v\tParse a valgrind-mmt trace.\n"
            ,*argv);
    iVar6 = 0x16;
  }
  else {
    if (local_f108 == (rnndeccolors *)0x0) {
      s.colors = &rnndec_colorsnull;
    }
    if (local_f100 == (code *)0x0) {
      s.op.flush = flush_dma;
    }
    s.filter.addr1 = 0xffffffff;
    __stream = fopen(local_f118,"r");
    if (__stream == (FILE *)0x0) {
      perror(*argv);
      piVar4 = __errno_location();
      iVar6 = *piVar4;
    }
    else {
      uVar7 = 0;
      rnn_init();
      db = rnn_newdb();
      s.db = db;
      rnn_parsefile(db,"nv_objects.xml");
      rnn_prepdb(db);
      s.dom = rnn_finddomain(db,"NV01_SUBCHAN");
      uVar1 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar1 = uVar7;
      }
      for (; uVar1 * 0x18 - uVar7 != 0; uVar7 = uVar7 + 0x18) {
        add_object(&s,*(uint32_t *)((long)&obj[0].handle + uVar7),
                   *(uint32_t *)((long)&obj[0].class + uVar7));
      }
      if (s.op.parse == parse_renouveau) {
        pcVar3 = dirname(local_f118);
        parse_renouveau_chipset(&s,pcVar3);
        parse_renouveau_objects(&s,pcVar3);
        parse_renouveau_startup(&s,pcVar3);
      }
      iVar6 = 0;
      dedma(&s,(FILE *)__stream,false);
      fclose(__stream);
      free(s.parse.buf);
    }
  }
  return iVar6;
}

Assistant:

int
main(int argc, char *argv[])
{
	struct state s = { };
	struct obj obj[MAX_OBJECTS];
	int nobj = 0;
	char *path = NULL;
	FILE *f;
	int i;

	/* parse the command line */
	if (!configure(&s, argc, argv, &path, obj, &nobj))
		return EINVAL;

	/* open the input */
	f = fopen(path, "r");
	if (!f) {
		perror(argv[0]);
		return errno;
	}

	/* set up an rnn context */
	rnn_init();
	s.db = rnn_newdb();
	rnn_parsefile(s.db, "nv_objects.xml");
	rnn_prepdb(s.db);
	s.dom = rnn_finddomain(s.db, "NV01_SUBCHAN");

	/* insert objects specified in the command line */
	for (i = 0; i < nobj; i++)
		add_object(&s, obj[i].handle, obj[i].class);

	if (s.op.parse == parse_renouveau) {
		path = dirname(path);
		parse_renouveau_chipset(&s, path);
		parse_renouveau_objects(&s, path);
		parse_renouveau_startup(&s, path);
	}

	/* do it */
	dedma(&s, f, false);

	/* clean up */
	fclose(f);
	free(s.parse.buf);

	return 0;
}